

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O1

void copyPixels(string *type,MultiPartInputFile *inputFile,MultiPartOutputFile *outputFile,
               int inputPartNumber,int outputPartNumber)

{
  size_t __n;
  int iVar1;
  
  __n = type->_M_string_length;
  if ((__n == DAT_0011a890) &&
     ((__n == 0 ||
      (iVar1 = bcmp((type->_M_dataplus)._M_p,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,__n), iVar1 == 0))))
  {
    copyPixels<Imf_3_4::InputPart,Imf_3_4::OutputPart>
              (inputFile,outputFile,inputPartNumber,outputPartNumber);
    return;
  }
  if ((__n == DAT_0011a8b0) &&
     ((__n == 0 ||
      (iVar1 = bcmp((type->_M_dataplus)._M_p,Imf_3_4::TILEDIMAGE_abi_cxx11_,__n), iVar1 == 0)))) {
    copyPixels<Imf_3_4::TiledInputPart,Imf_3_4::TiledOutputPart>
              (inputFile,outputFile,inputPartNumber,outputPartNumber);
    return;
  }
  if ((__n == DAT_0011a8d0) &&
     ((__n == 0 ||
      (iVar1 = bcmp((type->_M_dataplus)._M_p,Imf_3_4::DEEPSCANLINE_abi_cxx11_,__n), iVar1 == 0)))) {
    copyPixels<Imf_3_4::DeepScanLineInputPart,Imf_3_4::DeepScanLineOutputPart>
              (inputFile,outputFile,inputPartNumber,outputPartNumber);
    return;
  }
  if (__n != DAT_0011a8f0) {
    return;
  }
  if ((__n != 0) &&
     (iVar1 = bcmp((type->_M_dataplus)._M_p,Imf_3_4::DEEPTILE_abi_cxx11_,__n), iVar1 != 0)) {
    return;
  }
  copyPixels<Imf_3_4::DeepTiledInputPart,Imf_3_4::DeepTiledOutputPart>
            (inputFile,outputFile,inputPartNumber,outputPartNumber);
  return;
}

Assistant:

void
copyPixels (
    const std::string&   type,
    MultiPartInputFile&  inputFile,
    MultiPartOutputFile& outputFile,
    int                  inputPartNumber,
    int                  outputPartNumber)
{
    //
    // Copy pixels from a given part of a multipart input file
    // to a given part of a multipart output file.
    //

    if (type == SCANLINEIMAGE)
    {
        copyPixels<InputPart, OutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == TILEDIMAGE)
    {
        copyPixels<TiledInputPart, TiledOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == DEEPSCANLINE)
    {
        copyPixels<DeepScanLineInputPart, DeepScanLineOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == DEEPTILE)
    {
        copyPixels<DeepTiledInputPart, DeepTiledOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
}